

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O3

size_t lzham::lzham_msize(void *p)

{
  size_t sVar1;
  
  if (p != (void *)0x0) {
    if (((ulong)p & 0xf) == 0) {
      sVar1 = (*(code *)g_pMSize)(p,g_pUser_data);
      return sVar1;
    }
    lzham_assert("lzham_msize: bad ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_mem.cpp"
                 ,0x86);
  }
  return 0;
}

Assistant:

size_t lzham_msize(void* p)
   {
      if (!p)
         return 0;

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error("lzham_msize: bad ptr");
         return 0;
      }

      return (*g_pMSize)(p, g_pUser_data);
   }